

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OnDiskDataset.cpp
# Opt level: O1

vector<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_> *
OnDiskDataset::get_compact_candidates
          (vector<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>
           *__return_storage_ptr__,
          vector<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_> *datasets)

{
  pointer *pppOVar1;
  pointer ppOVar2;
  OnDiskDataset *pOVar3;
  pointer pOVar4;
  OnDiskDataset *pOVar5;
  iterator iVar6;
  pointer ppOVar7;
  long lVar8;
  OnDiskDataset **ppOVar9;
  OnDiskDataset **ppOVar10;
  ulong uVar11;
  ulong uVar12;
  uint uVar13;
  __normal_iterator<DatasetScore_*,_std::vector<DatasetScore,_std::allocator<DatasetScore>_>_> __i;
  OnDiskDataset *pOVar14;
  OnDiskDataset **ppOVar15;
  pointer pOVar16;
  ulong uVar17;
  path __result;
  OnDiskDataset **local_128;
  OnDiskDataset **local_118;
  OnDiskDataset **local_108;
  path local_f0;
  path local_b0;
  path local_70;
  
  (__return_storage_ptr__->
  super__Vector_base<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ppOVar7 = (datasets->
            super__Vector_base<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>).
            _M_impl.super__Vector_impl_data._M_start;
  ppOVar2 = (datasets->
            super__Vector_base<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>).
            _M_impl.super__Vector_impl_data._M_finish;
  if (8 < (ulong)((long)ppOVar2 - (long)ppOVar7)) {
    if (ppOVar7 == ppOVar2) {
      local_118 = (OnDiskDataset **)0x0;
      local_108 = (OnDiskDataset **)0x0;
      local_128 = (OnDiskDataset **)0x0;
    }
    else {
      local_128 = (OnDiskDataset **)0x0;
      local_108 = (OnDiskDataset **)0x0;
      local_118 = (OnDiskDataset **)0x0;
      do {
        pOVar3 = *ppOVar7;
        pOVar16 = (pOVar3->indices).super__Vector_base<OnDiskIndex,_std::allocator<OnDiskIndex>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        pOVar4 = (pOVar3->indices).super__Vector_base<OnDiskIndex,_std::allocator<OnDiskIndex>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
        if (pOVar16 == pOVar4) {
          pOVar14 = (OnDiskDataset *)0x0;
        }
        else {
          pOVar14 = (OnDiskDataset *)0x0;
          do {
            std::experimental::filesystem::v1::__cxx11::path::path(&local_f0,&pOVar3->db_base);
            std::experimental::filesystem::v1::__cxx11::path::
            path<std::__cxx11::string,std::experimental::filesystem::v1::__cxx11::path>
                      (&local_b0,&pOVar16->fname);
            std::experimental::filesystem::v1::__cxx11::path::path(&local_70,&local_f0);
            std::experimental::filesystem::v1::__cxx11::path::_M_append
                      (&local_70,&local_b0._M_pathname);
            lVar8 = std::experimental::filesystem::v1::file_size(&local_70);
            pOVar14 = (OnDiskDataset *)((long)&(pOVar14->name)._M_dataplus._M_p + lVar8);
            std::experimental::filesystem::v1::__cxx11::path::~path(&local_70);
            std::experimental::filesystem::v1::__cxx11::path::~path(&local_b0);
            std::experimental::filesystem::v1::__cxx11::path::~path(&local_f0);
            pOVar16 = pOVar16 + 1;
          } while (pOVar16 != pOVar4);
        }
        if (local_108 == local_118) {
          if ((long)local_108 - (long)local_128 == 0x7ffffffffffffff0) {
            std::__throw_length_error("vector::_M_realloc_insert");
          }
          uVar12 = (long)local_108 - (long)local_128 >> 4;
          uVar11 = uVar12;
          if (local_108 == local_128) {
            uVar11 = 1;
          }
          uVar17 = uVar11 + uVar12;
          if (0x7fffffffffffffe < uVar17) {
            uVar17 = 0x7ffffffffffffff;
          }
          if (CARRY8(uVar11,uVar12)) {
            uVar17 = 0x7ffffffffffffff;
          }
          if (uVar17 == 0) {
            ppOVar9 = (OnDiskDataset **)0x0;
          }
          else {
            ppOVar9 = (OnDiskDataset **)operator_new(uVar17 << 4);
          }
          ppOVar9[uVar12 * 2] = pOVar3;
          ppOVar9[uVar12 * 2 + 1] = pOVar14;
          ppOVar15 = ppOVar9;
          for (ppOVar10 = local_128; local_108 != ppOVar10; ppOVar10 = ppOVar10 + 2) {
            pOVar3 = ppOVar10[1];
            *ppOVar15 = *ppOVar10;
            ppOVar15[1] = pOVar3;
            ppOVar15 = ppOVar15 + 2;
          }
          if (local_128 != (OnDiskDataset **)0x0) {
            operator_delete(local_128,(long)local_118 - (long)local_128);
          }
          local_118 = ppOVar9 + uVar17 * 2;
          local_128 = ppOVar9;
        }
        else {
          *local_108 = pOVar3;
          local_108[1] = pOVar14;
          ppOVar15 = local_108;
        }
        local_108 = ppOVar15 + 2;
        ppOVar7 = ppOVar7 + 1;
      } while (ppOVar7 != ppOVar2);
    }
    if (local_128 != local_108) {
      uVar11 = (long)local_108 - (long)local_128 >> 4;
      lVar8 = 0x3f;
      if (uVar11 != 0) {
        for (; uVar11 >> lVar8 == 0; lVar8 = lVar8 + -1) {
        }
      }
      std::
      __introsort_loop<__gnu_cxx::__normal_iterator<OnDiskDataset::get_compact_candidates(std::vector<OnDiskDataset_const*,std::allocator<OnDiskDataset_const*>>const&)::DatasetScore*,std::vector<OnDiskDataset::get_compact_candidates(std::vector<OnDiskDataset_const*,std::allocator<OnDiskDataset_const*>>const&)::DatasetScore,std::allocator<OnDiskDataset::get_compact_candidates(std::vector<OnDiskDataset_const*,std::allocator<OnDiskDataset_const*>>const&)::DatasetScore>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<OnDiskDataset::get_compact_candidates(std::vector<OnDiskDataset_const*,std::allocator<OnDiskDataset_const*>>const&)::compare_size>>
                (local_128,local_108,((uint)lVar8 ^ 0x3f) * 2 ^ 0x7e);
      if ((long)local_108 - (long)local_128 < 0x101) {
        std::
        __insertion_sort<__gnu_cxx::__normal_iterator<OnDiskDataset::get_compact_candidates(std::vector<OnDiskDataset_const*,std::allocator<OnDiskDataset_const*>>const&)::DatasetScore*,std::vector<OnDiskDataset::get_compact_candidates(std::vector<OnDiskDataset_const*,std::allocator<OnDiskDataset_const*>>const&)::DatasetScore,std::allocator<OnDiskDataset::get_compact_candidates(std::vector<OnDiskDataset_const*,std::allocator<OnDiskDataset_const*>>const&)::DatasetScore>>>,__gnu_cxx::__ops::_Iter_comp_iter<OnDiskDataset::get_compact_candidates(std::vector<OnDiskDataset_const*,std::allocator<OnDiskDataset_const*>>const&)::compare_size>>
                  (local_128,local_108);
      }
      else {
        ppOVar9 = local_128 + 0x20;
        std::
        __insertion_sort<__gnu_cxx::__normal_iterator<OnDiskDataset::get_compact_candidates(std::vector<OnDiskDataset_const*,std::allocator<OnDiskDataset_const*>>const&)::DatasetScore*,std::vector<OnDiskDataset::get_compact_candidates(std::vector<OnDiskDataset_const*,std::allocator<OnDiskDataset_const*>>const&)::DatasetScore,std::allocator<OnDiskDataset::get_compact_candidates(std::vector<OnDiskDataset_const*,std::allocator<OnDiskDataset_const*>>const&)::DatasetScore>>>,__gnu_cxx::__ops::_Iter_comp_iter<OnDiskDataset::get_compact_candidates(std::vector<OnDiskDataset_const*,std::allocator<OnDiskDataset_const*>>const&)::compare_size>>
                  (local_128,ppOVar9);
        for (; ppOVar9 != local_108; ppOVar9 = ppOVar9 + 2) {
          pOVar3 = *ppOVar9;
          pOVar14 = ppOVar9[1];
          pOVar5 = ppOVar9[-1];
          ppOVar15 = ppOVar9;
          while (pOVar14 < pOVar5) {
            *ppOVar15 = ppOVar15[-2];
            ppOVar15[1] = ppOVar15[-1];
            pOVar5 = ppOVar15[-3];
            ppOVar15 = ppOVar15 + -2;
          }
          *ppOVar15 = pOVar3;
          ppOVar15[1] = pOVar14;
        }
      }
    }
    iVar6._M_current =
         (__return_storage_ptr__->
         super__Vector_base<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>)._M_impl.
         super__Vector_impl_data._M_finish;
    if (iVar6._M_current ==
        (__return_storage_ptr__->
        super__Vector_base<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>)._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<OnDiskDataset_const*,std::allocator<OnDiskDataset_const*>>::
      _M_realloc_insert<OnDiskDataset_const*const&>
                ((vector<OnDiskDataset_const*,std::allocator<OnDiskDataset_const*>> *)
                 __return_storage_ptr__,iVar6,local_128);
    }
    else {
      *iVar6._M_current = *local_128;
      pppOVar1 = &(__return_storage_ptr__->
                  super__Vector_base<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>)
                  ._M_impl.super__Vector_impl_data._M_finish;
      *pppOVar1 = *pppOVar1 + 1;
    }
    uVar11 = (long)local_108 - (long)local_128 >> 4;
    if (1 < uVar11) {
      uVar12 = 1;
      uVar13 = 2;
      do {
        if ((OnDiskDataset *)((long)local_128[(ulong)(uVar13 - 2) * 2 + 1] * 2) <=
            local_128[uVar12 * 2 + 1]) break;
        iVar6._M_current =
             (__return_storage_ptr__->
             super__Vector_base<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>).
             _M_impl.super__Vector_impl_data._M_finish;
        if (iVar6._M_current ==
            (__return_storage_ptr__->
            super__Vector_base<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>).
            _M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<OnDiskDataset_const*,std::allocator<OnDiskDataset_const*>>::
          _M_realloc_insert<OnDiskDataset_const*const&>
                    ((vector<OnDiskDataset_const*,std::allocator<OnDiskDataset_const*>> *)
                     __return_storage_ptr__,iVar6,local_128 + uVar12 * 2);
        }
        else {
          *iVar6._M_current = local_128[uVar12 * 2];
          pppOVar1 = &(__return_storage_ptr__->
                      super__Vector_base<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>
                      )._M_impl.super__Vector_impl_data._M_finish;
          *pppOVar1 = *pppOVar1 + 1;
        }
        uVar12 = (ulong)uVar13;
        uVar13 = uVar13 + 1;
      } while (uVar12 < uVar11);
    }
    ppOVar7 = (__return_storage_ptr__->
              super__Vector_base<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>).
              _M_impl.super__Vector_impl_data._M_start;
    ppOVar2 = (__return_storage_ptr__->
              super__Vector_base<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>).
              _M_impl.super__Vector_impl_data._M_finish;
    if ((ulong)((long)ppOVar2 - (long)ppOVar7) < 9 && ppOVar2 != ppOVar7) {
      (__return_storage_ptr__->
      super__Vector_base<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>)._M_impl.
      super__Vector_impl_data._M_finish = ppOVar7;
    }
    if (local_128 != (OnDiskDataset **)0x0) {
      operator_delete(local_128,(long)local_118 - (long)local_128);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

void OnDiskDataset::execute(const Query &query, ResultWriter *out,
                            QueryCounters *counters) const {
    std::unordered_set<IndexType> types_to_query;
    for (const auto &ndx : get_indexes()) {
        types_to_query.emplace(ndx.index_type());
    }
    Query plan = query.plan(types_to_query);
    plan = q_optimize(std::move(plan));
    spdlog::debug("PLAN: {}", plan);

    QueryResult result = this->query(plan, counters);
    if (result.is_everything()) {
        files_index->for_each_filename(
            [&out](const std::string &fname) { out->push_back(fname); });
    } else {
        for (const auto &fid : result.vector().decompressed()) {
            out->push_back(get_file_name(fid));
        }
    }
}